

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

GeneratorTracker *
Catch::Generators::GeneratorTracker::acquire(TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  ITracker *pIVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  GeneratorTracker *pGVar3;
  ITrackerPtr childTracker;
  undefined1 local_49;
  GeneratorTracker *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  GeneratorTracker *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  ITracker *local_28;
  
  pIVar1 = ctx->m_currentTracker;
  (*pIVar1->_vptr_ITracker[0xc])(&local_38,pIVar1,nameAndLocation);
  if (local_38 == (GeneratorTracker *)0x0) {
    local_48 = (GeneratorTracker *)0x0;
    local_28 = pIVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Catch::Generators::GeneratorTracker,std::allocator<Catch::Generators::GeneratorTracker>,Catch::TestCaseTracking::NameAndLocation_const&,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
              (&_Stack_40,&local_48,(allocator<Catch::Generators::GeneratorTracker> *)&local_49,
               nameAndLocation,ctx,&local_28);
    this._M_pi = _Stack_40._M_pi;
    pGVar3 = local_48;
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_40._M_pi)->_M_use_count = (_Stack_40._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_40._M_pi)->_M_use_count = (_Stack_40._M_pi)->_M_use_count + 1;
      }
    }
    (*pIVar1->_vptr_ITracker[0xb])(pIVar1,&local_48);
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_pi);
    }
  }
  else {
    iVar2 = (*(local_38->super_TrackerBase).super_ITracker._vptr_ITracker[0xf])();
    if ((char)iVar2 == '\0') {
      __assert_fail("childTracker->isGeneratorTracker()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pyxll[P]xlfparser/tests/catch.hpp"
                    ,0x2733,
                    "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                   );
    }
    this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30;
    pGVar3 = local_38;
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_30->_M_use_count = local_30->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_30->_M_use_count = local_30->_M_use_count + 1;
      }
    }
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if ((ctx->m_runState != CompletedCycle) &&
     (iVar2 = (*(pGVar3->super_TrackerBase).super_ITracker._vptr_ITracker[3])(pGVar3),
     (char)iVar2 == '\0')) {
    (pGVar3->super_TrackerBase).m_runState = Executing;
    ((pGVar3->super_TrackerBase).m_ctx)->m_currentTracker = (ITracker *)pGVar3;
    pIVar1 = (pGVar3->super_TrackerBase).m_parent;
    if (pIVar1 != (ITracker *)0x0) {
      (*pIVar1->_vptr_ITracker[0xd])();
    }
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_pi);
  }
  return pGVar3;
}

Assistant:

static GeneratorTracker& acquire( TrackerContext& ctx, TestCaseTracking::NameAndLocation const& nameAndLocation ) {
                std::shared_ptr<GeneratorTracker> tracker;

                ITracker& currentTracker = ctx.currentTracker();
                if( TestCaseTracking::ITrackerPtr childTracker = currentTracker.findChild( nameAndLocation ) ) {
                    assert( childTracker );
                    assert( childTracker->isGeneratorTracker() );
                    tracker = std::static_pointer_cast<GeneratorTracker>( childTracker );
                }
                else {
                    tracker = std::make_shared<GeneratorTracker>( nameAndLocation, ctx, &currentTracker );
                    currentTracker.addChild( tracker );
                }

                if( !ctx.completedCycle() && !tracker->isComplete() ) {
                    tracker->open();
                }

                return *tracker;
            }